

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_code_generator.cc
# Opt level: O0

string_view google::protobuf::compiler::anon_unknown_0::GetTestCase(void)

{
  char *__str;
  char *c_key;
  
  __str = getenv("TEST_CASE");
  if (__str == (char *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&c_key,anon_var_dwarf_37cdd0 + 5)
    ;
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&c_key,__str);
  }
  return _c_key;
}

Assistant:

absl::string_view GetTestCase() {
  const char* c_key = getenv("TEST_CASE");
  if (c_key == nullptr) {
    // In Windows, setting 'TEST_CASE=' is equivalent to unsetting
    // and therefore c_key can be nullptr
    return "";
  }
  return c_key;
}